

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int file_open(int pi,char *file,uint mode)

{
  int iVar1;
  size_t sVar2;
  gpioExtent_t ext [1];
  
  sVar2 = strlen(file);
  ext[0].size = (size_t)(int)sVar2;
  ext[0].ptr = file;
  iVar1 = pigpio_command_ext(pi,0x68,mode,0,(int)sVar2,1,ext,1);
  return iVar1;
}

Assistant:

int file_open(int pi, char *file, unsigned mode)
{
   int len;
   gpioExtent_t ext[1];

   len = strlen(file);

   /*
   p1=mode
   p2=0
   p3=len
   ## extension ##
   char file[len]
   */

   ext[0].size = len;
   ext[0].ptr = file;

   return pigpio_command_ext
      (pi, PI_CMD_FO, mode, 0, len, 1, ext, 1);
}